

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_settings_received(nghttp2_session *session,nghttp2_frame *frame,int noack)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  size_t in_RSI;
  nghttp2_settings_entry *in_RDI;
  uint8_t unaff_retaddr;
  nghttp2_settings_entry *entry;
  nghttp2_inflight_settings *settings;
  nghttp2_mem *mem;
  size_t i;
  int rv;
  nghttp2_mem *in_stack_ffffffffffffffb8;
  nghttp2_frame *in_stack_ffffffffffffffc0;
  nghttp2_session *in_stack_ffffffffffffffc8;
  nghttp2_settings_entry session_00;
  int32_t lib_error_code;
  nghttp2_frame *frame_00;
  nghttp2_session *in_stack_ffffffffffffffd8;
  nghttp2_session *session_01;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  frame_00 = (nghttp2_frame *)(in_RDI + 0x141);
  iVar1 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (*(int *)(in_RSI + 8) == 0) {
    if ((*(byte *)(in_RSI + 0xd) & 1) == 0) {
      if ((char)in_RDI[0x164].settings_id == '\0') {
        in_RDI[0x165].value = 0xffffffff;
        *(undefined1 *)&in_RDI[0x164].settings_id = 1;
      }
      for (session_01 = (nghttp2_session *)0x0; session_01 < *(nghttp2_session **)(in_RSI + 0x10);
          session_01 = (nghttp2_session *)((long)&(session_01->streams).table + 1)) {
        in_stack_ffffffffffffffc0 =
             (nghttp2_frame *)(*(long *)(in_RSI + 0x18) + (long)session_01 * 8);
        lib_error_code = (int32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
        switch((ulong)(*(int *)in_stack_ffffffffffffffc0 - 1)) {
        case 0:
          iVar1 = nghttp2_hd_deflate_change_table_size
                            ((nghttp2_hd_deflater *)&in_stack_ffffffffffffffc0->hd,
                             (ulong)(*(int *)in_stack_ffffffffffffffc0 - 1));
          if (iVar1 != 0) {
            iVar2 = nghttp2_is_fatal(iVar1);
            if (iVar2 != 0) {
              return iVar1;
            }
            iVar1 = session_handle_invalid_connection
                              (session_01,frame_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                               (char *)in_stack_ffffffffffffffc0);
            return iVar1;
          }
          in_RDI[0x164].value =
               *(uint32_t *)
                ((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->hd_table).
                        buffer + 4);
          break;
        case 1:
          if ((*(int *)((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->
                               hd_table).buffer + 4) != 0) &&
             (*(int *)((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->
                              hd_table).buffer + 4) != 1)) {
            iVar1 = session_handle_invalid_connection
                              (session_01,frame_00,lib_error_code,(char *)in_stack_ffffffffffffffc0)
            ;
            return iVar1;
          }
          if (((char)in_RDI[0x16e].value == '\0') &&
             (*(int *)((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->
                              hd_table).buffer + 4) != 0)) {
            iVar1 = session_handle_invalid_connection
                              (session_01,frame_00,lib_error_code,(char *)in_stack_ffffffffffffffc0)
            ;
            return iVar1;
          }
          in_RDI[0x165].settings_id =
               *(int32_t *)
                ((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->hd_table).
                        buffer + 4);
          break;
        case 2:
          in_RDI[0x165].value =
               *(uint32_t *)
                ((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->hd_table).
                        buffer + 4);
          break;
        case 3:
          if (0x7fffffff <
              *(uint *)((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->
                               hd_table).buffer + 4)) {
            iVar1 = session_handle_invalid_connection
                              (session_01,frame_00,lib_error_code,(char *)in_stack_ffffffffffffffc0)
            ;
            return iVar1;
          }
          iVar1 = session_update_remote_initial_window_size
                            ((nghttp2_session *)&frame_00->hd,lib_error_code);
          iVar2 = nghttp2_is_fatal(iVar1);
          if (iVar2 != 0) {
            return iVar1;
          }
          if (iVar1 != 0) {
            iVar1 = session_handle_invalid_connection
                              (session_01,frame_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                               (char *)in_stack_ffffffffffffffc0);
            return iVar1;
          }
          in_RDI[0x166].settings_id =
               *(int32_t *)
                ((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->hd_table).
                        buffer + 4);
          break;
        case 4:
          if ((*(uint *)((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->
                                hd_table).buffer + 4) < 0x4000) ||
             (0xffffff <
              *(uint *)((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->
                               hd_table).buffer + 4))) {
            iVar1 = session_handle_invalid_connection
                              (session_01,frame_00,lib_error_code,(char *)in_stack_ffffffffffffffc0)
            ;
            return iVar1;
          }
          in_RDI[0x166].value =
               *(uint32_t *)
                ((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->hd_table).
                        buffer + 4);
          break;
        case 5:
          in_RDI[0x167].settings_id =
               *(int32_t *)
                ((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->hd_table).
                        buffer + 4);
          break;
        case 7:
          if ((*(int *)((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->
                               hd_table).buffer + 4) != 0) &&
             (*(int *)((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->
                              hd_table).buffer + 4) != 1)) {
            iVar1 = session_handle_invalid_connection
                              (session_01,frame_00,lib_error_code,(char *)in_stack_ffffffffffffffc0)
            ;
            return iVar1;
          }
          if ((((char)in_RDI[0x16e].value == '\0') && (in_RDI[0x167].value != 0)) &&
             (*(int *)((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->
                              hd_table).buffer + 4) == 0)) {
            iVar1 = session_handle_invalid_connection
                              (session_01,frame_00,lib_error_code,(char *)in_stack_ffffffffffffffc0)
            ;
            return iVar1;
          }
          in_RDI[0x167].value =
               *(uint32_t *)
                ((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->hd_table).
                        buffer + 4);
          break;
        case 8:
          if ((*(int *)((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->
                               hd_table).buffer + 4) != 0) &&
             (*(int *)((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->
                              hd_table).buffer + 4) != 1)) {
            iVar1 = session_handle_invalid_connection
                              (session_01,frame_00,lib_error_code,(char *)in_stack_ffffffffffffffc0)
            ;
            return iVar1;
          }
          if ((in_RDI[0x168].settings_id != -1) &&
             (in_RDI[0x168].settings_id !=
              *(int *)((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->
                              hd_table).buffer + 4))) {
            iVar1 = session_handle_invalid_connection
                              (session_01,frame_00,lib_error_code,(char *)in_stack_ffffffffffffffc0)
            ;
            return iVar1;
          }
          in_RDI[0x168].settings_id =
               *(int32_t *)
                ((long)&(((nghttp2_hd_context *)&(in_stack_ffffffffffffffc0->hd).length)->hd_table).
                        buffer + 4);
        }
      }
      if ((((in_RDI[0x168].settings_id == -1) &&
           (in_RDI[0x168].settings_id = 0, (char)in_RDI[0x16e].value != '\0')) &&
          (*(char *)((long)&in_RDI[0x16e].settings_id + 2) != '\0')) &&
         ((in_RDI[0x16c].value & 0x20) != 0)) {
        *(undefined1 *)((long)&in_RDI[0x16e].settings_id + 3) = 1;
      }
      if (((in_EDX == 0) &&
          (iVar1 = session_is_closing((nghttp2_session *)&in_stack_ffffffffffffffc0->hd), iVar1 == 0
          )) && (iVar1 = nghttp2_session_add_settings
                                   ((nghttp2_session *)entry,unaff_retaddr,
                                    (nghttp2_settings_entry *)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    (size_t)in_RDI), iVar1 != 0)) {
        iVar2 = nghttp2_is_fatal(iVar1);
        if (iVar2 == 0) {
          iVar1 = session_handle_invalid_connection
                            (session_01,frame_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                             (char *)in_stack_ffffffffffffffc0);
        }
      }
      else {
        iVar1 = session_call_on_frame_received(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      }
    }
    else if (*(long *)(in_RSI + 0x10) == 0) {
      session_00 = in_RDI[0x14b];
      if (session_00 == (nghttp2_settings_entry)0x0) {
        iVar1 = session_handle_invalid_connection
                          (in_stack_ffffffffffffffd8,frame_00,0,(char *)in_stack_ffffffffffffffc0);
      }
      else {
        iVar1 = nghttp2_session_update_local_settings
                          ((nghttp2_session *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                           in_RSI);
        in_RDI[0x14b] = *(nghttp2_settings_entry *)session_00;
        inflight_settings_del
                  ((nghttp2_inflight_settings *)&in_stack_ffffffffffffffc0->hd,
                   in_stack_ffffffffffffffb8);
        if (iVar1 == 0) {
          iVar1 = session_call_on_frame_received
                            ((nghttp2_session *)session_00,in_stack_ffffffffffffffc0);
        }
        else {
          iVar2 = nghttp2_is_fatal(iVar1);
          if (iVar2 == 0) {
            iVar1 = session_handle_invalid_connection
                              (in_stack_ffffffffffffffd8,frame_00,session_00.value,
                               (char *)in_stack_ffffffffffffffc0);
          }
        }
      }
    }
    else {
      iVar1 = session_handle_invalid_connection
                        (in_stack_ffffffffffffffd8,frame_00,iVar1,(char *)in_stack_ffffffffffffffc0)
      ;
    }
  }
  else {
    iVar1 = session_handle_invalid_connection
                      (in_stack_ffffffffffffffd8,frame_00,iVar1,(char *)in_stack_ffffffffffffffc0);
  }
  return iVar1;
}

Assistant:

int nghttp2_session_on_settings_received(nghttp2_session *session,
                                         nghttp2_frame *frame, int noack) {
  int rv;
  size_t i;
  nghttp2_mem *mem;
  nghttp2_inflight_settings *settings;

  mem = &session->mem;

  if (frame->hd.stream_id != 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "SETTINGS: stream_id != 0");
  }
  if (frame->hd.flags & NGHTTP2_FLAG_ACK) {
    if (frame->settings.niv != 0) {
      return session_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_FRAME_SIZE_ERROR,
        "SETTINGS: ACK and payload != 0");
    }

    settings = session->inflight_settings_head;

    if (!settings) {
      return session_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO, "SETTINGS: unexpected ACK");
    }

    rv = nghttp2_session_update_local_settings(session, settings->iv,
                                               settings->niv);

    session->inflight_settings_head = settings->next;

    inflight_settings_del(settings, mem);

    if (rv != 0) {
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
      return session_handle_invalid_connection(session, frame, rv, NULL);
    }
    return session_call_on_frame_received(session, frame);
  }

  if (!session->remote_settings_received) {
    session->remote_settings.max_concurrent_streams =
      NGHTTP2_DEFAULT_MAX_CONCURRENT_STREAMS;
    session->remote_settings_received = 1;
  }

  for (i = 0; i < frame->settings.niv; ++i) {
    nghttp2_settings_entry *entry = &frame->settings.iv[i];

    switch (entry->settings_id) {
    case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:

      rv = nghttp2_hd_deflate_change_table_size(&session->hd_deflater,
                                                entry->value);
      if (rv != 0) {
        if (nghttp2_is_fatal(rv)) {
          return rv;
        } else {
          return session_handle_invalid_connection(
            session, frame, NGHTTP2_ERR_HEADER_COMP, NULL);
        }
      }

      session->remote_settings.header_table_size = entry->value;

      break;
    case NGHTTP2_SETTINGS_ENABLE_PUSH:

      if (entry->value != 0 && entry->value != 1) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "SETTINGS: invalid SETTINGS_ENBLE_PUSH");
      }

      if (!session->server && entry->value != 0) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "SETTINGS: server attempted to enable push");
      }

      session->remote_settings.enable_push = entry->value;

      break;
    case NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS:

      session->remote_settings.max_concurrent_streams = entry->value;

      break;
    case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:

      /* Update the initial window size of the all active streams */
      /* Check that initial_window_size < (1u << 31) */
      if (entry->value > NGHTTP2_MAX_WINDOW_SIZE) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_FLOW_CONTROL,
          "SETTINGS: too large SETTINGS_INITIAL_WINDOW_SIZE");
      }

      rv = session_update_remote_initial_window_size(session,
                                                     (int32_t)entry->value);

      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      if (rv != 0) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_FLOW_CONTROL, NULL);
      }

      session->remote_settings.initial_window_size = entry->value;

      break;
    case NGHTTP2_SETTINGS_MAX_FRAME_SIZE:

      if (entry->value < NGHTTP2_MAX_FRAME_SIZE_MIN ||
          entry->value > NGHTTP2_MAX_FRAME_SIZE_MAX) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "SETTINGS: invalid SETTINGS_MAX_FRAME_SIZE");
      }

      session->remote_settings.max_frame_size = entry->value;

      break;
    case NGHTTP2_SETTINGS_MAX_HEADER_LIST_SIZE:

      session->remote_settings.max_header_list_size = entry->value;

      break;
    case NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL:

      if (entry->value != 0 && entry->value != 1) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "SETTINGS: invalid SETTINGS_ENABLE_CONNECT_PROTOCOL");
      }

      if (!session->server &&
          session->remote_settings.enable_connect_protocol &&
          entry->value == 0) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "SETTINGS: server attempted to disable "
          "SETTINGS_ENABLE_CONNECT_PROTOCOL");
      }

      session->remote_settings.enable_connect_protocol = entry->value;

      break;
    case NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES:

      if (entry->value != 0 && entry->value != 1) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "SETTINGS: invalid SETTINGS_NO_RFC7540_PRIORITIES");
      }

      if (session->remote_settings.no_rfc7540_priorities != UINT32_MAX &&
          session->remote_settings.no_rfc7540_priorities != entry->value) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "SETTINGS: SETTINGS_NO_RFC7540_PRIORITIES cannot be changed");
      }

      session->remote_settings.no_rfc7540_priorities = entry->value;

      break;
    }
  }

  if (session->remote_settings.no_rfc7540_priorities == UINT32_MAX) {
    session->remote_settings.no_rfc7540_priorities = 0;

    if (session->server && session->pending_no_rfc7540_priorities &&
        (session->opt_flags &
         NGHTTP2_OPTMASK_SERVER_FALLBACK_RFC7540_PRIORITIES)) {
      session->fallback_rfc7540_priorities = 1;
    }
  }

  if (!noack && !session_is_closing(session)) {
    rv = nghttp2_session_add_settings(session, NGHTTP2_FLAG_ACK, NULL, 0);

    if (rv != 0) {
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      return session_handle_invalid_connection(session, frame,
                                               NGHTTP2_ERR_INTERNAL, NULL);
    }
  }

  return session_call_on_frame_received(session, frame);
}